

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *pHVar1;
  HLSLObjectInfo *pHVar2;
  __node_base_ptr p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  iterator TmpToken;
  HashMapStringKey local_48;
  iterator *local_38;
  
  p_Var4 = ScopeStart->_M_node;
  local_38 = ScopeEnd;
  if (ScopeEnd->_M_node != p_Var4) {
    do {
      if ((*(int *)&p_Var4[1]._M_next == 0x13b) &&
         (pHVar2 = FindHLSLObject(this,(String *)&p_Var4[1]._M_prev),
         pHVar2 != (HLSLObjectInfo *)0x0)) {
        pHVar1 = this->m_Converter;
        HashMapStringKey::HashMapStringKey(&local_48,(pHVar2->GLSLType)._M_dataplus._M_p,false);
        p_Var3 = std::
                 _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::_M_find_before_node
                           (&(pHVar1->m_ImageTypes)._M_h,
                            (local_48.Ownership_Hash & 0x7fffffffffffffff) %
                            (pHVar1->m_ImageTypes)._M_h._M_bucket_count,&local_48,
                            local_48.Ownership_Hash & 0x7fffffffffffffff);
        if (p_Var3 == (__node_base_ptr)0x0) {
          bVar6 = true;
        }
        else {
          bVar6 = p_Var3->_M_nxt == (_Hash_node_base *)0x0;
        }
        if (((_List_node_base *)local_48.Str != (_List_node_base *)0x0) &&
           ((long)local_48.Ownership_Hash < 0)) {
          operator_delete__(local_48.Str);
        }
        ScopeEnd = local_38;
        if (bVar6) {
          p_Var5 = p_Var4->_M_next;
        }
        else {
          local_48.Str = (Char *)p_Var4;
          bVar6 = ProcessRWTextureStore(this,(iterator *)&local_48,local_38,pHVar2->ArrayDim);
          p_Var5 = (_List_node_base *)local_48.Str;
          if ((!bVar6) &&
             (local_48.Str = (Char *)p_Var4,
             bVar6 = ProcessRWTextureLoad(this,(iterator *)&local_48,ScopeEnd,pHVar2->ArrayDim),
             p_Var5 = (_List_node_base *)local_48.Str, !bVar6)) goto LAB_001f3d08;
        }
      }
      else {
LAB_001f3d08:
        p_Var5 = p_Var4->_M_next;
      }
      p_Var4 = p_Var5;
    } while (p_Var5 != ScopeEnd->_M_node);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures(const TokenListType::iterator& ScopeStart,
                                                                 const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            // Try to find the object in all scopes
            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo == nullptr)
            {
                ++Token;
                continue;
            }

            // Check if the object is image type
            auto ImgTypeIt = m_Converter.m_ImageTypes.find(pObjectInfo->GLSLType.c_str());
            if (ImgTypeIt == m_Converter.m_ImageTypes.end())
            {
                ++Token;
                continue;
            }

            {
                // Handle store first. If this is not a store operation,
                // ProcessRWTextureStore() returns false.
                auto TmpToken = Token;
                if (ProcessRWTextureStore(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            {
                // Handle load.
                auto TmpToken = Token;
                if (ProcessRWTextureLoad(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            ++Token;
        }
        else
            ++Token;
    }
}